

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::MessageLite::SerializePartialToArray(MessageLite *this,void *data,int size)

{
  int size_00;
  undefined4 extraout_var;
  LogMessage *pLVar1;
  LogMessage local_88;
  string local_50;
  LogFinisher local_29;
  ulong value;
  
  size_00 = (*this->_vptr_MessageLite[9])();
  value = CONCAT44(extraout_var,size_00);
  if ((value & 0xffffffff80000000) == 0) {
    if (value <= (ulong)(long)size) {
      SerializeToArrayImpl(this,(uint8 *)data,size_00);
      return true;
    }
  }
  else {
    internal::LogMessage::LogMessage
              (&local_88,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/message_lite.cc"
               ,0x1e7);
    (*this->_vptr_MessageLite[2])(&local_50,this);
    pLVar1 = internal::LogMessage::operator<<(&local_88,&local_50);
    pLVar1 = internal::LogMessage::operator<<(pLVar1," exceeded maximum protobuf size of 2GB: ");
    pLVar1 = internal::LogMessage::operator<<(pLVar1,value);
    internal::LogFinisher::operator=(&local_29,pLVar1);
    std::__cxx11::string::~string((string *)&local_50);
    internal::LogMessage::~LogMessage(&local_88);
  }
  return false;
}

Assistant:

bool MessageLite::SerializePartialToArray(void* data, int size) const {
  const size_t byte_size = ByteSizeLong();
  if (byte_size > INT_MAX) {
    GOOGLE_LOG(ERROR) << GetTypeName()
               << " exceeded maximum protobuf size of 2GB: " << byte_size;
    return false;
  }
  if (size < byte_size) return false;
  uint8* start = reinterpret_cast<uint8*>(data);
  SerializeToArrayImpl(*this, start, byte_size);
  return true;
}